

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

void Parse(lemon *gp)

{
  char *pcVar1;
  ushort *puVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  FILE *__stream;
  ulong uVar6;
  char *__ptr;
  size_t sVar7;
  long lVar8;
  long lVar9;
  ushort **ppuVar10;
  rule *prVar11;
  undefined8 *puVar12;
  symbol *psVar13;
  undefined8 *puVar14;
  long *__ptr_00;
  void *pvVar15;
  byte bVar16;
  byte bVar17;
  ulong uVar18;
  char *pcVar19;
  int iVar20;
  uint uVar21;
  int iVar22;
  char *pcVar23;
  char cVar24;
  byte bVar25;
  ulong uVar26;
  char **ppcVar27;
  uint uVar28;
  size_t sVar29;
  long lVar30;
  char *pcVar31;
  char *pcVar32;
  char *pcVar33;
  ulong uVar34;
  bool bVar35;
  bool bVar36;
  char *endptr;
  size_t local_3fd0;
  int local_3fa8;
  char *local_3f78 [8];
  char *local_3f38;
  uint local_3f30;
  int local_3f2c;
  char *local_3f28;
  lemon *local_3f20;
  undefined4 local_3f18;
  symbol *local_3f10;
  symbol *local_3f08;
  char *local_3f00;
  uint local_3ef8;
  long alStack_3ef0 [999];
  undefined8 auStack_1fb8 [1001];
  rule *local_70;
  char *local_68;
  char **local_60;
  int local_58;
  int *local_50;
  undefined4 local_48;
  int iStack_44;
  rule *prStack_40;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  memset(&local_3f30,0,0x3f00);
  pcVar33 = gp->filename;
  local_3f18 = 0;
  local_3f38 = pcVar33;
  local_3f20 = gp;
  __stream = fopen(pcVar33,"rb");
  if (__stream == (FILE *)0x0) {
    Parse_cold_11();
  }
  else {
    fseek(__stream,0,2);
    uVar6 = ftell(__stream);
    rewind(__stream);
    uVar21 = (int)uVar6 + 1;
    __ptr = (char *)malloc((long)(int)uVar21);
    if (__ptr == (char *)0x0) {
      ErrorMsg(pcVar33,0,"Can\'t allocate %d of memory to hold this file.",(ulong)uVar21);
      gp->errorcnt = gp->errorcnt + 1;
    }
    else {
      sVar29 = (size_t)(int)uVar6;
      sVar7 = fread(__ptr,1,sVar29,__stream);
      if (sVar7 == sVar29) {
        fclose(__stream);
        __ptr[sVar29] = '\0';
        ppcVar27 = azDefine;
        iVar5 = nDefine;
        uVar6 = (ulong)(uint)nDefine;
        lVar8 = (long)nDefine;
        pcVar33 = __ptr + 6;
        lVar30 = 0;
        uVar26 = 6;
        iVar22 = 0;
        local_3fa8 = 0;
        pcVar31 = __ptr + 1;
        pcVar32 = __ptr;
        do {
          cVar24 = __ptr[lVar30];
          if (cVar24 != '\n') {
            if (cVar24 == '%') {
              pcVar19 = __ptr + lVar30;
              if ((lVar30 == 0) || (pcVar19[-1] == '\n')) {
                iVar4 = strncmp(pcVar19,"%endif",6);
                if ((iVar4 == 0) &&
                   (ppuVar10 = __ctype_b_loc(),
                   (*(byte *)((long)*ppuVar10 + (long)pcVar19[6] * 2 + 1) & 0x20) != 0)) {
                  pcVar19 = pcVar32;
                  if (iVar22 == 0) {
                    iVar22 = 0;
                  }
                  else {
                    iVar22 = iVar22 + -1;
                    if (iVar22 == 0) {
                      lVar9 = (long)local_3fa8;
                      if (lVar9 < lVar30) {
                        do {
                          if (__ptr[lVar9] != '\n') {
                            __ptr[lVar9] = ' ';
                          }
                          lVar9 = lVar9 + 1;
                        } while (lVar30 != lVar9);
                      }
                      iVar22 = 0;
                    }
                  }
                  for (; (*pcVar19 != '\0' && (*pcVar19 != '\n')); pcVar19 = pcVar19 + 1) {
                    *pcVar19 = ' ';
                  }
                }
                else {
                  iVar4 = strncmp(pcVar19,"%ifdef",6);
                  if (((iVar4 == 0) &&
                      (ppuVar10 = __ctype_b_loc(),
                      (*(byte *)((long)*ppuVar10 + (long)pcVar19[6] * 2 + 1) & 0x20) != 0)) ||
                     ((iVar4 = strncmp(pcVar19,"%ifndef",7), iVar4 == 0 &&
                      (ppuVar10 = __ctype_b_loc(),
                      (*(byte *)((long)*ppuVar10 + (long)pcVar19[7] * 2 + 1) & 0x20) != 0)))) {
                    if (iVar22 == 0) {
                      ppuVar10 = __ctype_b_loc();
                      uVar18 = uVar26;
                      pcVar23 = pcVar33;
                      do {
                        pcVar1 = pcVar23 + 1;
                        pcVar23 = pcVar23 + 1;
                        uVar18 = uVar18 + 1;
                      } while ((*(byte *)((long)*ppuVar10 + (long)*pcVar1 * 2 + 1) & 0x20) != 0);
                      cVar24 = __ptr[uVar18 & 0xffffffff];
                      bVar36 = false;
                      uVar34 = 0;
                      if (cVar24 != '\0') {
                        uVar34 = 0;
                        do {
                          if ((*(byte *)((long)*ppuVar10 + (long)cVar24 * 2 + 1) & 0x20) != 0)
                          break;
                          cVar24 = (__ptr + 1)[uVar34 + (uVar18 & 0xffffffff)];
                          uVar34 = uVar34 + 1;
                        } while (cVar24 != '\0');
                      }
                      if (iVar5 < 1) {
                        bVar35 = true;
                      }
                      else {
                        bVar36 = true;
                        uVar18 = 1;
                        do {
                          pcVar1 = ppcVar27[uVar18 - 1];
                          iVar22 = strncmp(pcVar1,pcVar23,uVar34 & 0xffffffff);
                          if ((iVar22 == 0) && (sVar7 = strlen(pcVar1), (int)uVar34 == (int)sVar7))
                          {
                            bVar35 = false;
                            goto LAB_00106589;
                          }
                          bVar36 = (long)uVar18 < lVar8;
                          bVar35 = uVar18 != uVar6;
                          uVar18 = uVar18 + 1;
                        } while (bVar35);
                        bVar35 = true;
                      }
LAB_00106589:
                      if (pcVar19[3] != 'n') {
                        bVar36 = bVar35;
                      }
                      if (bVar36) {
                        iVar22 = 1;
                        local_3fa8 = (int)lVar30;
                      }
                      else {
                        iVar22 = 0;
                      }
                    }
                    else {
                      iVar22 = iVar22 + 1;
                    }
                    cVar24 = '%';
                    pcVar19 = pcVar31;
                    while ((cVar24 != '\0' && (cVar24 != '\n'))) {
                      pcVar19[-1] = ' ';
                      cVar24 = *pcVar19;
                      pcVar19 = pcVar19 + 1;
                    }
                  }
                }
              }
            }
            else if (cVar24 == '\0') goto LAB_001065db;
          }
          lVar30 = lVar30 + 1;
          pcVar32 = pcVar32 + 1;
          pcVar33 = pcVar33 + 1;
          uVar26 = uVar26 + 1;
          pcVar31 = pcVar31 + 1;
        } while( true );
      }
      ErrorMsg(pcVar33,0,"Can\'t read in all %d bytes of this file.",uVar6 & 0xffffffff);
      free(__ptr);
      gp->errorcnt = gp->errorcnt + 1;
    }
  }
  return;
LAB_001065db:
  if (iVar22 != 0) {
    Parse_cold_1();
    if (x2a != (s_x2 *)0x0) {
      return;
    }
    return;
  }
  pcVar33 = __ptr;
  uVar21 = 1;
LAB_001065ef:
  do {
    cVar24 = *pcVar33;
    pcVar31 = pcVar33;
    while( true ) {
      if (cVar24 == '\n') {
        uVar21 = uVar21 + 1;
      }
      else if (cVar24 == '\0') {
        free(__ptr);
        gp->rule = prStack_40;
        gp->errorcnt = local_3f2c;
        return;
      }
      ppuVar10 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar10 + (long)cVar24 * 2 + 1) & 0x20) != 0) {
        pcVar33 = pcVar31 + 1;
        goto LAB_001065ef;
      }
      pcVar32 = pcVar31;
      uVar28 = uVar21;
      if (cVar24 != '/') {
        if (cVar24 != '{') {
          if (cVar24 == '\"') {
            do {
              pcVar33 = pcVar32 + 1;
              while( true ) {
                pcVar32 = pcVar33;
                cVar24 = *pcVar32;
                if (cVar24 == '\n') break;
                pcVar33 = pcVar32 + 1;
                local_3f30 = uVar21;
                local_3f28 = pcVar31;
                if (cVar24 == '\"') goto LAB_0010689c;
                if (cVar24 == '\0') {
                  Parse_cold_2();
                  pcVar33 = pcVar32;
                  goto LAB_0010689c;
                }
              }
              uVar28 = uVar28 + 1;
            } while( true );
          }
          goto LAB_001066e7;
        }
        bVar16 = pcVar31[1];
        pcVar33 = pcVar31 + 1;
        if (bVar16 == 0) goto LAB_00107392;
        iVar5 = 1;
        pcVar19 = pcVar31;
        goto LAB_0010677b;
      }
      if (pcVar31[1] != '/') break;
      for (pcVar31 = pcVar31 + 2; (cVar24 = *pcVar31, cVar24 != '\0' && (cVar24 != '\n'));
          pcVar31 = pcVar31 + 1) {
      }
    }
    if (pcVar31[1] != '*') {
LAB_001066e7:
      puVar2 = *ppuVar10;
      if ((puVar2[cVar24] & 8) == 0) {
        if ((cVar24 == '/') || (cVar24 == '|')) {
          if ((*(byte *)((long)puVar2 + (long)pcVar31[1] * 2 + 1) & 4) == 0) goto LAB_00106887;
          cVar24 = pcVar31[2];
          pcVar32 = pcVar31 + 2;
          while ((pcVar33 = pcVar32, local_3f30 = uVar21, local_3f28 = pcVar31, cVar24 != '\0' &&
                 ((cVar24 == '_' || ((puVar2[cVar24] & 8) != 0))))) {
            cVar24 = pcVar32[1];
            pcVar32 = pcVar32 + 1;
          }
        }
        else if (((cVar24 == ':') && (pcVar31[1] == ':')) && (pcVar31[2] == '=')) {
          pcVar32 = pcVar31 + 3;
          pcVar33 = pcVar32;
          local_3f30 = uVar21;
          local_3f28 = pcVar31;
        }
        else {
LAB_00106887:
          pcVar32 = pcVar31 + 1;
          pcVar33 = pcVar32;
          local_3f30 = uVar21;
          local_3f28 = pcVar31;
        }
      }
      else {
        cVar24 = *pcVar31;
        while ((pcVar33 = pcVar32, local_3f30 = uVar21, local_3f28 = pcVar31, cVar24 != '\0' &&
               ((cVar24 == '_' || ((puVar2[cVar24] & 8) != 0))))) {
          cVar24 = pcVar32[1];
          pcVar32 = pcVar32 + 1;
        }
      }
      goto LAB_0010689c;
    }
    cVar24 = pcVar31[2];
    if (cVar24 == '\0') {
      pcVar33 = pcVar31 + 2;
    }
    else {
      pcVar31 = pcVar31 + 3;
      do {
        pcVar33 = pcVar31;
        if (cVar24 == '\n') {
          uVar21 = uVar21 + 1;
        }
        else if ((cVar24 == '/') && (pcVar33[-2] == '*')) {
          pcVar33 = pcVar33 + -1;
          lVar8 = 1;
          goto LAB_0010675b;
        }
        cVar24 = *pcVar33;
        pcVar31 = pcVar33 + 1;
      } while (cVar24 != '\0');
    }
    lVar8 = 0;
LAB_0010675b:
    pcVar33 = pcVar33 + lVar8;
  } while( true );
LAB_0010677b:
  do {
    pcVar32 = pcVar33;
    if ((iVar5 < 2) && (bVar16 == 0x7d)) {
      pcVar33 = pcVar19 + 2;
      local_3f30 = uVar21;
      local_3f28 = pcVar31;
      goto LAB_0010689c;
    }
    if (bVar16 < 0x2f) {
      if (bVar16 == 10) {
LAB_00106862:
        uVar28 = uVar28 + 1;
      }
      else if ((bVar16 == 0x22) || (bVar16 == 0x27)) {
        bVar17 = pcVar32[1];
        pcVar32 = pcVar32 + 1;
        if (bVar17 != 0) {
          bVar25 = 0;
          do {
            if ((bVar25 != 0x5c) && (bVar17 == bVar16)) break;
            uVar28 = uVar28 + (bVar17 == 10);
            bVar36 = bVar25 == 0x5c;
            bVar25 = bVar17;
            if (bVar36) {
              bVar25 = 0;
            }
            bVar17 = pcVar32[1];
            pcVar32 = pcVar32 + 1;
          } while (bVar17 != 0);
        }
      }
    }
    else if (bVar16 == 0x2f) {
      if (pcVar19[2] == '/') {
        for (pcVar32 = pcVar19 + 3; *pcVar32 != '\0'; pcVar32 = pcVar32 + 1) {
          if (*pcVar32 == '\n') goto LAB_00106862;
        }
      }
      else if (pcVar19[2] == '*') {
        pcVar32 = pcVar19 + 3;
        if (pcVar19[3] != '\0') {
          cVar24 = '\0';
          cVar3 = pcVar19[3];
          do {
            if (cVar24 == '*' && cVar3 == '/') break;
            uVar28 = uVar28 + (cVar3 == '\n');
            pcVar33 = pcVar32 + 1;
            pcVar32 = pcVar32 + 1;
            cVar24 = cVar3;
            cVar3 = *pcVar33;
          } while (*pcVar33 != '\0');
        }
      }
    }
    else if (bVar16 == 0x7b) {
      iVar5 = iVar5 + 1;
    }
    else if (bVar16 == 0x7d) {
      iVar5 = iVar5 + -1;
    }
    bVar16 = pcVar32[1];
    pcVar33 = pcVar32 + 1;
    pcVar19 = pcVar32;
  } while (bVar16 != 0);
LAB_00107392:
  pcVar32 = pcVar33;
  local_3f30 = uVar21;
  local_3f28 = pcVar31;
  ErrorMsg(local_3f38,uVar21,
           "C code starting on this line is not terminated before the end of the file.");
  local_3f2c = local_3f2c + 1;
  pcVar33 = pcVar32;
LAB_0010689c:
  cVar24 = *pcVar32;
  *pcVar32 = '\0';
  pcVar31 = Strsafe(local_3f28);
  prVar11 = local_70;
  uVar21 = local_3ef8;
  psVar13 = local_3f10;
  switch(local_3f18) {
  case 0:
    local_70 = (rule *)0x0;
    uStack_34 = 0;
    iStack_44 = 0;
    prStack_40 = (rule *)0x0;
    uStack_38 = 0;
    local_3f20->nrule = 0;
  case 1:
    cVar3 = *pcVar31;
    if ((long)cVar3 == 0x25) {
LAB_00106e18:
      local_3f18 = 2;
    }
    else if ((*(byte *)((long)*ppuVar10 + (long)cVar3 * 2 + 1) & 2) == 0) {
      if (cVar3 == '[') {
        local_3f18 = 0xc;
      }
      else if (cVar3 == '{') {
        if (local_70 == (rule *)0x0) {
          Parse_cold_10();
          psVar13 = local_3f10;
        }
        else if (local_70->code == (char *)0x0) {
          local_70->line = local_3f30;
          local_70->code = pcVar31 + 1;
        }
        else {
          Parse_cold_9();
          psVar13 = local_3f10;
        }
      }
      else {
        pcVar19 = "Token \"%s\" should be either \"%%\" or a nonterminal name.";
LAB_00107910:
        ErrorMsg(local_3f38,local_3f30,pcVar19,pcVar31);
        local_3f2c = local_3f2c + 1;
        psVar13 = local_3f10;
      }
    }
    else {
      local_3f08 = Symbol_new(pcVar31);
      local_3ef8 = 0;
      local_3f00 = (char *)0x0;
      local_3f18 = 5;
      psVar13 = local_3f10;
    }
    goto switchD_001068d6_default;
  case 2:
    if ((*(byte *)((long)*ppuVar10 + (long)*pcVar31 * 2 + 1) & 4) != 0) {
      local_60 = (char **)0x0;
      local_50 = (int *)0x0;
      local_58 = 1;
      local_3f18 = 3;
      local_68 = pcVar31;
      iVar5 = strcmp(pcVar31,"name");
      if (iVar5 == 0) {
        local_60 = &local_3f20->name;
        goto LAB_001072f4;
      }
      iVar5 = strcmp(pcVar31,"include");
      if (iVar5 == 0) {
        local_60 = &local_3f20->include;
        psVar13 = local_3f10;
        goto switchD_001068d6_default;
      }
      iVar5 = strcmp(pcVar31,"code");
      if (iVar5 == 0) {
        lVar8 = 0x98;
      }
      else {
        iVar5 = strcmp(pcVar31,"token_destructor");
        if (iVar5 == 0) {
          lVar8 = 0xa0;
        }
        else {
          iVar5 = strcmp(pcVar31,"default_destructor");
          if (iVar5 == 0) {
            lVar8 = 0xa8;
          }
          else {
            iVar5 = strcmp(pcVar31,"token_prefix");
            if (iVar5 == 0) {
              local_60 = &local_3f20->tokenprefix;
LAB_001072f4:
              local_58 = 0;
              psVar13 = local_3f10;
              goto switchD_001068d6_default;
            }
            iVar5 = strcmp(pcVar31,"syntax_error");
            if (iVar5 == 0) {
              local_60 = &local_3f20->error;
              psVar13 = local_3f10;
              goto switchD_001068d6_default;
            }
            iVar5 = strcmp(pcVar31,"parse_accept");
            if (iVar5 == 0) {
              lVar8 = 0x90;
            }
            else {
              iVar5 = strcmp(pcVar31,"parse_failure");
              if (iVar5 != 0) {
                iVar5 = strcmp(pcVar31,"stack_overflow");
                if (iVar5 == 0) {
                  local_60 = &local_3f20->overflow;
                  psVar13 = local_3f10;
                  goto switchD_001068d6_default;
                }
                iVar5 = strcmp(pcVar31,"extra_argument");
                if (iVar5 == 0) {
                  local_60 = &local_3f20->arg;
                }
                else {
                  iVar5 = strcmp(pcVar31,"token_type");
                  if (iVar5 == 0) {
                    local_60 = &local_3f20->tokentype;
                  }
                  else {
                    iVar5 = strcmp(pcVar31,"default_type");
                    if (iVar5 == 0) {
                      local_60 = &local_3f20->vartype;
                    }
                    else {
                      iVar5 = strcmp(pcVar31,"stack_size");
                      if (iVar5 == 0) {
                        local_60 = &local_3f20->stacksize;
                      }
                      else {
                        iVar5 = strcmp(pcVar31,"start_symbol");
                        if (iVar5 != 0) {
                          iVar5 = strcmp(pcVar31,"left");
                          if (iVar5 == 0) {
                            iStack_44 = iStack_44 + 1;
                            local_48 = 0;
                          }
                          else {
                            iVar5 = strcmp(pcVar31,"right");
                            if (iVar5 == 0) {
                              iStack_44 = iStack_44 + 1;
                              local_48 = 1;
                            }
                            else {
                              iVar5 = strcmp(pcVar31,"nonassoc");
                              if (iVar5 != 0) {
                                iVar5 = strcmp(pcVar31,"destructor");
                                if (iVar5 == 0) {
                                  local_3f18 = 0x10;
                                  psVar13 = local_3f10;
                                  goto switchD_001068d6_default;
                                }
                                iVar5 = strcmp(pcVar31,"type");
                                if (iVar5 == 0) {
                                  local_3f18 = 0x11;
                                  psVar13 = local_3f10;
                                  goto switchD_001068d6_default;
                                }
                                iVar5 = strcmp(pcVar31,"fallback");
                                if (iVar5 == 0) {
                                  local_3f10 = (symbol *)0x0;
                                  local_3f18 = 0x12;
                                  psVar13 = local_3f10;
                                  goto switchD_001068d6_default;
                                }
                                iVar5 = strcmp(pcVar31,"wildcard");
                                if (iVar5 == 0) {
                                  local_3f18 = 0x14;
                                  psVar13 = local_3f10;
                                  goto switchD_001068d6_default;
                                }
                                iVar5 = strcmp(pcVar31,"expect");
                                if (iVar5 == 0) {
                                  if (local_3f20->nexpected < 0) {
                                    local_3f18 = 0x13;
                                    psVar13 = local_3f10;
                                    goto switchD_001068d6_default;
                                  }
                                  pcVar31 = "Multiple %expect declarations.";
                                  goto LAB_001076f8;
                                }
                                pcVar19 = "Unknown declaration keyword: \"%%%s\".";
                                goto LAB_001076b6;
                              }
                              iStack_44 = iStack_44 + 1;
                              local_48 = 2;
                            }
                          }
                          local_3f18 = 4;
                          psVar13 = local_3f10;
                          goto switchD_001068d6_default;
                        }
                        local_60 = &local_3f20->start;
                      }
                    }
                  }
                }
                goto LAB_001072f4;
              }
              lVar8 = 0x88;
            }
          }
        }
      }
      local_60 = (char **)((long)&local_3f20->sorted + lVar8);
      psVar13 = local_3f10;
      goto switchD_001068d6_default;
    }
    pcVar19 = "Illegal declaration keyword: \"%s\".";
LAB_001076b6:
    ErrorMsg(local_3f38,local_3f30,pcVar19,pcVar31);
    goto LAB_001076ff;
  case 3:
    cVar3 = *pcVar31;
    if (((cVar3 == '\"') || (cVar3 == '{')) || (((*ppuVar10)[cVar3] & 8) != 0)) {
      if ((cVar3 == '{') || (cVar3 == '\"')) {
        pcVar31 = pcVar31 + 1;
      }
      sVar7 = strlen(pcVar31);
      ppcVar27 = local_60;
      pcVar19 = *local_60;
      pcVar23 = pcVar19;
      if (pcVar19 == (char *)0x0) {
        pcVar23 = "";
      }
      sVar29 = strlen(pcVar23);
      iVar5 = (int)sVar7;
      iVar22 = (int)sVar29;
      iVar4 = iVar5 + iVar22 + 0x14;
      if ((local_3f20->nolinenosflag == 0) && (local_58 != 0)) {
        if ((local_50 == (int *)0x0) || (*local_50 != 0)) {
          iVar20 = 0;
          pcVar19 = local_3f38;
          do {
            if (*pcVar19 == '\\') {
              iVar20 = iVar20 + 1;
            }
            else if (*pcVar19 == '\0') goto LAB_0010727c;
            pcVar19 = pcVar19 + 1;
          } while( true );
        }
        bVar36 = false;
        local_3fd0 = 0;
      }
      else {
        local_3fd0 = 0;
        bVar36 = false;
      }
      goto LAB_00107446;
    }
    ErrorMsg(local_3f38,local_3f30,"Illegal argument to %%%s: %s",local_68,pcVar31);
    goto LAB_001076ff;
  case 4:
    if ((long)*pcVar31 == 0x2e) break;
    if ((*(byte *)((long)*ppuVar10 + (long)*pcVar31 * 2 + 1) & 1) == 0) {
      pcVar19 = "Can\'t assign a precedence to \"%s\".";
    }
    else {
      psVar13 = Symbol_new(pcVar31);
      if (psVar13->prec < 0) {
        psVar13->prec = iStack_44;
        psVar13->assoc = local_48;
        psVar13 = local_3f10;
        goto switchD_001068d6_default;
      }
      pcVar19 = "Symbol \"%s\" has already be given a precedence.";
    }
    goto LAB_00107910;
  case 5:
    if (*pcVar31 == '(') {
      local_3f18 = 7;
      goto switchD_001068d6_default;
    }
    if (((*pcVar31 != ':') || (pcVar31[1] != ':')) || (pcVar31[2] != '=')) {
      pcVar31 = local_3f08->name;
      pcVar19 = "Expected to see a \":\" following the LHS symbol \"%s\".";
      goto LAB_0010755f;
    }
    goto LAB_00106f06;
  case 6:
    cVar3 = *pcVar31;
    if ((long)cVar3 != 0x2e) {
      if ((*(byte *)((long)*ppuVar10 + (long)cVar3 * 2 + 1) & 4) == 0) {
        if (cVar3 == '(') {
          if (0 < (int)local_3ef8) {
            local_3f18 = 10;
            goto switchD_001068d6_default;
          }
        }
        else if (((cVar3 == '|') || (cVar3 == '/')) && (0 < (int)local_3ef8)) {
          uVar21 = local_3ef8 - 1;
          puVar12 = (undefined8 *)alStack_3ef0[uVar21];
          if (*(int *)((long)puVar12 + 0xc) == 2) {
            __ptr_00 = (long *)puVar12[0xb];
            iVar5 = *(int *)((long)puVar12 + 0x54) + 1;
            puVar14 = puVar12;
          }
          else {
            puVar14 = (undefined8 *)calloc(1,0x60);
            *(undefined4 *)((long)puVar14 + 0xc) = 2;
            *(undefined4 *)((long)puVar14 + 0x54) = 1;
            __ptr_00 = (long *)calloc(1,8);
            puVar14[0xb] = __ptr_00;
            *__ptr_00 = (long)puVar12;
            *puVar14 = *puVar12;
            alStack_3ef0[uVar21] = (long)puVar14;
            iVar5 = 2;
          }
          *(int *)((long)puVar14 + 0x54) = iVar5;
          pvVar15 = realloc(__ptr_00,(long)iVar5 << 3);
          puVar14[0xb] = pvVar15;
          psVar13 = Symbol_new(pcVar31 + 1);
          *(symbol **)(puVar14[0xb] + -8 + (long)*(int *)((long)puVar14 + 0x54) * 8) = psVar13;
          if (((*(byte *)((long)*ppuVar10 + (long)pcVar31[1] * 2 + 1) & 2) != 0) ||
             (psVar13 = local_3f10,
             (*(byte *)((long)*ppuVar10 + (long)*(char *)**(undefined8 **)puVar14[0xb] * 2 + 1) & 2)
             != 0)) {
            Parse_cold_4();
            psVar13 = local_3f10;
          }
          goto switchD_001068d6_default;
        }
        pcVar19 = "Illegal character on RHS of rule: \"%s\".";
      }
      else {
        lVar8 = (long)(int)local_3ef8;
        if (lVar8 < 1000) {
          psVar13 = Symbol_new(pcVar31);
          alStack_3ef0[lVar8] = (long)psVar13;
          auStack_1fb8[lVar8 + 1] = 0;
          local_3ef8 = uVar21 + 1;
          psVar13 = local_3f10;
          goto switchD_001068d6_default;
        }
        pcVar19 = "Too many symbols on RHS of rule beginning at \"%s\".";
      }
      goto LAB_0010755f;
    }
    uVar6 = (ulong)local_3ef8;
    lVar8 = (long)(int)local_3ef8;
    prVar11 = (rule *)calloc(lVar8 * 0x10 + 0x60,1);
    if (prVar11 == (rule *)0x0) {
      Parse_cold_5();
      local_70 = prVar11;
    }
    else {
      prVar11->ruleline = local_3f30;
      prVar11->rhs = &prVar11[1].lhs;
      prVar11->rhsalias = (char **)(&prVar11[1].lhs + lVar8);
      if (0 < (int)uVar21) {
        uVar26 = 0;
        do {
          prVar11->rhs[uVar26] = (symbol *)alStack_3ef0[uVar26];
          prVar11->rhsalias[uVar26] = (char *)auStack_1fb8[uVar26 + 1];
          uVar26 = uVar26 + 1;
        } while (uVar6 != uVar26);
      }
      prVar11->lhs = local_3f08;
      prVar11->lhsalias = local_3f00;
      prVar11->nrhs = uVar21;
      prVar11->code = (char *)0x0;
      prVar11->precsym = (symbol *)0x0;
      iVar5 = local_3f20->nrule;
      local_3f20->nrule = iVar5 + 1;
      prVar11->index = iVar5;
      prVar11->nextlhs = local_3f08->rule;
      local_3f08->rule = prVar11;
      prVar11->next = (rule *)0x0;
      puVar12 = (undefined8 *)(CONCAT44(uStack_34,uStack_38) + 0x58);
      if (prStack_40 == (rule *)0x0) {
        puVar12 = (undefined8 *)&uStack_38;
      }
      *puVar12 = prVar11;
      (&prStack_40)[prStack_40 != (rule *)0x0] = prVar11;
      local_70 = prVar11;
    }
    break;
  case 7:
    if ((*(byte *)((long)*ppuVar10 + (long)*pcVar31 * 2 + 1) & 4) != 0) {
      local_3f18 = 8;
      local_3f00 = pcVar31;
      goto switchD_001068d6_default;
    }
    pcVar19 = local_3f08->name;
    pcVar23 = "\"%s\" is not a valid alias for the LHS \"%s\"\n";
    goto LAB_00107742;
  case 8:
    if (*pcVar31 == ')') {
      local_3f18 = 9;
      goto switchD_001068d6_default;
    }
LAB_00107407:
    pcVar19 = "Missing \")\" following LHS alias name \"%s\".";
    pcVar31 = local_3f00;
LAB_0010755f:
    ErrorMsg(local_3f38,local_3f30,pcVar19,pcVar31);
    goto LAB_00107749;
  case 9:
    if (((*pcVar31 != ':') || (pcVar31[1] != ':')) || (pcVar31[2] != '=')) {
      pcVar31 = local_3f08->name;
      pcVar23 = "Missing \"->\" following: \"%s(%s)\".";
      pcVar19 = local_3f00;
      goto LAB_00107742;
    }
    goto LAB_00106f06;
  case 10:
    if ((*(byte *)((long)*ppuVar10 + (long)*pcVar31 * 2 + 1) & 4) != 0) {
      auStack_1fb8[(int)local_3ef8] = pcVar31;
      local_3f18 = 0xb;
      goto switchD_001068d6_default;
    }
    pcVar19 = *(char **)alStack_3ef0[(long)(int)local_3ef8 + -1];
    pcVar23 = "\"%s\" is not a valid alias for the RHS symbol \"%s\"\n";
LAB_00107742:
    ErrorMsg(local_3f38,local_3f30,pcVar23,pcVar31,pcVar19);
LAB_00107749:
    local_3f2c = local_3f2c + 1;
    local_3f18 = 0xe;
    psVar13 = local_3f10;
    goto switchD_001068d6_default;
  case 0xb:
    if (*pcVar31 != ')') goto LAB_00107407;
LAB_00106f06:
    local_3f18 = 6;
    goto switchD_001068d6_default;
  case 0xc:
    if ((*(byte *)((long)*ppuVar10 + (long)*pcVar31 * 2 + 1) & 1) == 0) {
      Parse_cold_8();
    }
    else if (local_70 == (rule *)0x0) {
      ErrorMsg(local_3f38,local_3f30,"There is no prior rule to assign precedence \"[%s]\".");
      local_3f2c = local_3f2c + 1;
    }
    else if (local_70->precsym == (symbol *)0x0) {
      psVar13 = Symbol_new(pcVar31);
      prVar11->precsym = psVar13;
    }
    else {
      Parse_cold_7();
    }
    local_3f18 = 0xd;
    psVar13 = local_3f10;
    goto switchD_001068d6_default;
  case 0xd:
    if (*pcVar31 != ']') {
      Parse_cold_6();
    }
    break;
  case 0xe:
  case 0xf:
    cVar3 = *pcVar31;
    if (cVar3 == '.') {
      local_3f18 = 1;
      cVar3 = *pcVar31;
    }
    if (cVar3 != '%') goto switchD_001068d6_default;
    goto LAB_00106e18;
  case 0x10:
    if ((*(byte *)((long)*ppuVar10 + (long)*pcVar31 * 2 + 1) & 4) != 0) {
      psVar13 = Symbol_new(pcVar31);
      local_60 = &psVar13->destructor;
      local_50 = &psVar13->destLineno;
      local_58 = 1;
      local_3f18 = 3;
      psVar13 = local_3f10;
      goto switchD_001068d6_default;
    }
    pcVar31 = "Symbol name missing after %%destructor keyword";
    goto LAB_001076f8;
  case 0x11:
    if ((*(byte *)((long)*ppuVar10 + (long)*pcVar31 * 2 + 1) & 4) != 0) {
      psVar13 = Symbol_find(pcVar31);
      if (psVar13 == (symbol *)0x0) {
        psVar13 = Symbol_new(pcVar31);
      }
      else if (psVar13->datatype != (char *)0x0) {
        ErrorMsg(local_3f38,local_3f30,"Symbol %%type \"%s\" already defined",pcVar31);
        local_3f2c = local_3f2c + 1;
        local_3f18 = 0xf;
        psVar13 = local_3f10;
        goto switchD_001068d6_default;
      }
      local_60 = &psVar13->datatype;
      local_58 = 0;
      local_3f18 = 3;
      psVar13 = local_3f10;
      goto switchD_001068d6_default;
    }
    pcVar31 = "Symbol name missing after %%type keyword";
LAB_001076f8:
    ErrorMsg(local_3f38,local_3f30,pcVar31);
LAB_001076ff:
    local_3f2c = local_3f2c + 1;
    local_3f18 = 0xf;
    psVar13 = local_3f10;
    goto switchD_001068d6_default;
  case 0x12:
    if ((long)*pcVar31 != 0x2e) {
      if ((*(byte *)((long)*ppuVar10 + (long)*pcVar31 * 2 + 1) & 1) == 0) {
        pcVar19 = "%%fallback argument \"%s\" should be a token";
      }
      else {
        psVar13 = Symbol_new(pcVar31);
        if (local_3f10 == (symbol *)0x0) goto switchD_001068d6_default;
        if (psVar13->fallback == (symbol *)0x0) {
          psVar13->fallback = local_3f10;
          local_3f20->has_fallback = 1;
          psVar13 = local_3f10;
          goto switchD_001068d6_default;
        }
        pcVar19 = "More than one fallback assigned to token %s";
      }
      goto LAB_00107910;
    }
    break;
  case 0x13:
    lVar8 = strtol(pcVar31,local_3f78,10);
    local_3f20->nexpected = (int)lVar8;
    if (((local_3f78[0] == pcVar31) || (*local_3f78[0] != '\0')) || ((int)lVar8 < 0)) {
      Parse_cold_3();
    }
    break;
  case 0x14:
    if ((long)*pcVar31 != 0x2e) {
      if ((*(byte *)((long)*ppuVar10 + (long)*pcVar31 * 2 + 1) & 1) == 0) {
        pcVar19 = "%%wildcard argument \"%s\" should be a token";
      }
      else {
        psVar13 = Symbol_new(pcVar31);
        if (local_3f20->wildcard == (symbol *)0x0) {
          local_3f20->wildcard = psVar13;
          psVar13 = local_3f10;
          goto switchD_001068d6_default;
        }
        pcVar19 = "Extra wildcard to token: %s";
      }
      goto LAB_00107910;
    }
    break;
  default:
    goto switchD_001068d6_default;
  }
LAB_00107515:
  local_3f18 = 1;
  psVar13 = local_3f10;
switchD_001068d6_default:
  local_3f10 = psVar13;
  *pcVar32 = cVar24;
  uVar21 = uVar28;
  goto LAB_001065ef;
LAB_0010727c:
  sprintf((char *)local_3f78,"#line %d ",(ulong)local_3f30);
  sVar7 = strlen((char *)local_3f78);
  sVar29 = strlen(local_3f38);
  iVar4 = iVar20 + iVar4 + (int)sVar7 + (int)sVar29;
  local_3fd0 = (size_t)(int)sVar7;
  pcVar19 = *local_60;
  bVar36 = true;
  ppcVar27 = local_60;
LAB_00107446:
  pcVar19 = (char *)realloc(pcVar19,(long)iVar4);
  *ppcVar27 = pcVar19;
  pcVar19 = *local_60 + iVar22;
  if (bVar36) {
    if ((iVar22 != 0) && (pcVar19[-1] != '\n')) {
      *pcVar19 = '\n';
      pcVar19 = pcVar19 + 1;
    }
    memcpy(pcVar19,local_3f78,local_3fd0);
    pcVar23 = pcVar19 + local_3fd0;
    pcVar19[local_3fd0] = '\"';
    pcVar19 = local_3f38;
    do {
      cVar3 = *pcVar19;
      if (cVar3 == '\\') {
        pcVar23[1] = '\\';
        pcVar23 = pcVar23 + 2;
        cVar3 = *pcVar19;
      }
      else {
        if (cVar3 == '\0') goto LAB_001074d5;
        pcVar23 = pcVar23 + 1;
      }
      *pcVar23 = cVar3;
      pcVar19 = pcVar19 + 1;
    } while( true );
  }
  goto LAB_001074e2;
LAB_001074d5:
  pcVar23[1] = '\"';
  pcVar23[2] = '\n';
  pcVar19 = pcVar23 + 3;
LAB_001074e2:
  if ((local_50 != (int *)0x0) && (*local_50 == 0)) {
    *local_50 = local_3f30;
  }
  memcpy(pcVar19,pcVar31,(long)iVar5);
  pcVar19[iVar5] = '\0';
  goto LAB_00107515;
}

Assistant:

void Parse(struct lemon *gp)
{
  struct pstate ps;
  FILE *fp;
  char *filebuf;
  int filesize;
  int lineno;
  int c;
  char *cp, *nextcp;
  int startline = 0;

  memset(&ps, '\0', sizeof(ps));
  ps.gp = gp;
  ps.filename = gp->filename;
  ps.errorcnt = 0;
  ps.state = INITIALIZE;

  /* Begin by reading the input file */
  fp = fopen(ps.filename,"rb");
  if( fp==0 ){
    ErrorMsg(ps.filename,0,"Can't open this file for reading.");
    gp->errorcnt++;
    return;
  }
  fseek(fp,0,2);
  filesize = ftell(fp);
  rewind(fp);
  filebuf = (char *)malloc( filesize+1 );
  if( filebuf==0 ){
    ErrorMsg(ps.filename,0,"Can't allocate %d of memory to hold this file.",
      filesize+1);
    gp->errorcnt++;
    return;
  }
  if( fread(filebuf,1,filesize,fp)!=filesize ){
    ErrorMsg(ps.filename,0,"Can't read in all %d bytes of this file.",
      filesize);
    free(filebuf);
    gp->errorcnt++;
    return;
  }
  fclose(fp);
  filebuf[filesize] = 0;

  /* Make an initial pass through the file to handle %ifdef and %ifndef */
  preprocess_input(filebuf);

  /* Now scan the text of the input file */
  lineno = 1;
  for(cp=filebuf; (c= *cp)!=0; ){
    if( c=='\n' ) lineno++;              /* Keep track of the line number */
    if( isspace(c) ){ cp++; continue; }  /* Skip all white space */
    if( c=='/' && cp[1]=='/' ){          /* Skip C++ style comments */
      cp+=2;
      while( (c= *cp)!=0 && c!='\n' ) cp++;
      continue;
    }
    if( c=='/' && cp[1]=='*' ){          /* Skip C style comments */
      cp+=2;
      while( (c= *cp)!=0 && (c!='/' || cp[-1]!='*') ){
        if( c=='\n' ) lineno++;
        cp++;
      }
      if( c ) cp++;
      continue;
    }
    ps.tokenstart = cp;                /* Mark the beginning of the token */
    ps.tokenlineno = lineno;           /* Linenumber on which token begins */
    if( c=='\"' ){                     /* String literals */
      cp++;
      while( (c= *cp)!=0 && c!='\"' ){
        if( c=='\n' ) lineno++;
        cp++;
      }
      if( c==0 ){
        ErrorMsg(ps.filename,startline,
"String starting on this line is not terminated before the end of the file.");
        ps.errorcnt++;
        nextcp = cp;
      }else{
        nextcp = cp+1;
      }
    }else if( c=='{' ){               /* A block of C code */
      int level;
      cp++;
      for(level=1; (c= *cp)!=0 && (level>1 || c!='}'); cp++){
        if( c=='\n' ) lineno++;
        else if( c=='{' ) level++;
        else if( c=='}' ) level--;
        else if( c=='/' && cp[1]=='*' ){  /* Skip comments */
          int prevc;
          cp = &cp[2];
          prevc = 0;
          while( (c= *cp)!=0 && (c!='/' || prevc!='*') ){
            if( c=='\n' ) lineno++;
            prevc = c;
            cp++;
	  }
	}else if( c=='/' && cp[1]=='/' ){  /* Skip C++ style comments too */
          cp = &cp[2];
          while( (c= *cp)!=0 && c!='\n' ) cp++;
          if( c ) lineno++;
	}else if( c=='\'' || c=='\"' ){    /* String a character literals */
          int startchar, prevc;
          startchar = c;
          prevc = 0;
          for(cp++; (c= *cp)!=0 && (c!=startchar || prevc=='\\'); cp++){
            if( c=='\n' ) lineno++;
            if( prevc=='\\' ) prevc = 0;
            else              prevc = c;
	  }
	}
      }
      if( c==0 ){
        ErrorMsg(ps.filename,ps.tokenlineno,
"C code starting on this line is not terminated before the end of the file.");
        ps.errorcnt++;
        nextcp = cp;
      }else{
        nextcp = cp+1;
      }
    }else if( isalnum(c) ){          /* Identifiers */
      while( (c= *cp)!=0 && (isalnum(c) || c=='_') ) cp++;
      nextcp = cp;
    }else if( c==':' && cp[1]==':' && cp[2]=='=' ){ /* The operator "::=" */
      cp += 3;
      nextcp = cp;
    }else if( (c=='/' || c=='|') && isalpha(cp[1]) ){
      cp += 2;
      while( (c = *cp)!=0 && (isalnum(c) || c=='_') ) cp++;
      nextcp = cp;
    }else{                          /* All other (one character) operators */
      cp++;
      nextcp = cp;
    }
    c = *cp;
    *cp = 0;                        /* Null terminate the token */
    parseonetoken(&ps);             /* Parse the token */
    *cp = c;                        /* Restore the buffer */
    cp = nextcp;
  }
  free(filebuf);                    /* Release the buffer after parsing */
  gp->rule = ps.firstrule;
  gp->errorcnt = ps.errorcnt;
}